

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

int Sfm_DecPeformDec3(Sfm_Dec_t *p,Abc_Obj_t *pObj)

{
  Vec_Int_t *p_00;
  Vec_Ptr_t *vGates;
  Vec_Ptr_t *vFans;
  Sfm_Par_t *pSVar1;
  int w;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  abctime aVar9;
  Mio_Gate_t *pGate;
  Mio_Gate_t *pGate_00;
  char *pFans1;
  char *pFans2;
  abctime aVar10;
  long lVar11;
  ulong uVar12;
  int extraout_EDX;
  int extraout_EDX_00;
  int nBits;
  int (*pSupp_00) [16];
  ulong uVar13;
  int iVar14;
  int i;
  int iVar15;
  word (*pTruth) [4];
  bool bVar16;
  bool bVar17;
  double dVar18;
  double dVar19;
  int local_12a8;
  uint local_12a4;
  Mio_Gate_t *local_1280;
  Mio_Gate_t *local_1278;
  char *local_1270;
  char *local_1268;
  word *local_1260;
  Vec_Int_t vFanins;
  int nSupp [4];
  word Masks [2] [8];
  word uTruth [4] [4];
  int pSupp [4] [16];
  int pAssump [1000];
  
  pSVar1 = p->pPars;
  bVar17 = true;
  if (pSVar1->fPrintDecs == 0) {
    bVar17 = pSVar1->fVeryVerbose != 0;
  }
  uVar2 = pSVar1->nDecMax;
  uVar13 = 1;
  if (1 < (int)uVar2) {
    uVar13 = (ulong)uVar2;
  }
  if (pSVar1->fArea != 0) {
    __assert_fail("p->pPars->fArea == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                  ,0x4bf,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
  }
  p->DelayMin = 0;
  if (bVar17) {
    printf("\nNode %4d : MFFC %2d\n",(ulong)(uint)p->iTarget,(ulong)(uint)p->nMffc);
    uVar2 = p->pPars->nDecMax;
  }
  if (4 < (int)uVar2) {
    __assert_fail("p->pPars->nDecMax <= SFM_DEC_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                  ,0x4c5,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
  }
  Sfm_ObjSetupSimInfo(pObj);
  (p->vObjDec).nSize = 0;
  p_00 = &p->vObjMap;
  vGates = &p->vMatchGates;
  vFans = &p->vMatchFans;
  local_12a4 = 0xffffffff;
  local_1260 = uTruth[0];
  uVar12 = 0;
  iVar3 = 0;
  local_1280 = (Mio_Gate_t *)0x0;
  local_1278 = (Mio_Gate_t *)0x0;
  local_1270 = (char *)0x0;
  local_1268 = (char *)0x0;
  do {
    if (uVar12 == uVar13) {
      Sfm_ObjSetdownSimInfo(pObj);
      if (local_12a4 == 0xffffffff) {
        if (bVar17) {
          puts("Best  : NO DEC.");
        }
        p->nNoDecs = p->nNoDecs + 1;
        iVar3 = -2;
      }
      else {
        lVar11 = (long)(int)local_12a4;
        if (bVar17) {
          printf("Best %d: %d  ",(ulong)local_12a4,(ulong)(uint)nSupp[lVar11]);
        }
        iVar3 = Sfm_LibImplementGatesDelay
                          (p->pLib,pSupp[lVar11],local_1280,local_1278,local_1270,local_1268,
                           &p->vObjGates,&p->vObjFanins);
        if (p->pPars->nVarMax < nSupp[lVar11]) {
          __assert_fail("nSupp[iBest] <= p->pPars->nVarMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                        ,0x539,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        p->nLuckySizes[nSupp[lVar11]] = p->nLuckySizes[nSupp[lVar11]] + 1;
        if (2 < iVar3) {
          __assert_fail("RetValue <= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                        ,0x53b,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        p->nLuckyGates[iVar3] = p->nLuckyGates[iVar3] + 1;
        p->DelayMin = local_12a8;
        iVar3 = 1;
      }
      return iVar3;
    }
    local_12a8 = Sfm_ManReadObjDelay(p,pObj->Id);
    iVar8 = (p->vObjDec).nSize;
    iVar5 = extraout_EDX;
    if (iVar3 < iVar8) {
      Vec_IntShrink(&p->vObjDec,iVar3);
      iVar8 = (p->vObjDec).nSize;
      iVar5 = extraout_EDX_00;
    }
    Abc_TtMask(Masks[0],p->nPats[0],iVar5);
    Abc_TtMask(Masks[1],p->nPats[1],nBits);
    pTruth = uTruth + uVar12;
    pSupp_00 = pSupp + uVar12;
    iVar3 = Sfm_DecPeformDec_rec(p,*pTruth,*pSupp_00,pAssump,0,Masks,1,0);
    nSupp[uVar12] = iVar3;
    if (iVar3 == -2) {
LAB_0044a9b7:
      if (bVar17) {
        printf("Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n",uVar12,(ulong)(uint)p->nPats[0],
               (ulong)(uint)p->nPats[1]);
      }
    }
    else {
      if (bVar17) {
        printf("Dec  %d: Pat0 = %2d  Pat1 = %2d  Supp = %d  ",uVar12,(ulong)(uint)p->nPats[0],
               (ulong)(uint)p->nPats[1]);
        Dau_DsdPrintFromTruth(*pTruth,iVar3);
      }
      if (((iVar3 == 1) && (p->pTim != (Sfm_Tim_t *)0x0)) && ((*pTruth)[0] == 0x5555555555555555)) {
        iVar5 = p->DelayInv;
        iVar4 = Vec_IntEntry(p_00,(*pSupp_00)[0]);
        iVar4 = Sfm_ManReadObjDelay(p,iVar4);
        if (local_12a8 <= iVar4 + iVar5) goto LAB_0044a9b7;
      }
      if ((iVar3 == 1) && (p->pMit != (Sfm_Mit_t *)0x0)) {
        if ((*pTruth)[0] != 0x5555555555555555) {
LAB_0044adba:
          p->nSuppVars = iVar3;
          for (lVar11 = 0x7c; lVar11 != 0x80; lVar11 = lVar11 + 1) {
            *(word *)(p->GateAnd + lVar11 * 2 + -0x1e) = *local_1260;
            local_1260 = local_1260 + 1;
          }
          iVar8 = Sfm_LibImplementSimple
                            (p->pLib,*pTruth,*pSupp_00,iVar3,&p->vObjGates,&p->vObjFanins);
          if (iVar3 <= p->pPars->nVarMax) {
            p->nLuckySizes[iVar3] = p->nLuckySizes[iVar3] + 1;
            if (iVar8 < 3) {
              p->nLuckyGates[iVar8] = p->nLuckyGates[iVar8] + 1;
              return iVar8;
            }
            __assert_fail("RetValue <= 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                          ,0x4f1,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
          }
          __assert_fail("nSupp[i] <= p->pPars->nVarMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                        ,0x4ef,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        goto LAB_0044a9b7;
      }
      if (iVar3 < 2) goto LAB_0044adba;
      Sfm_DecPrepareVec(p_00,*pSupp_00,iVar3,&p->vGateCut);
      iVar5 = Sfm_DecMffcAreaReal(pObj,&p->vGateCut,&p->vGateMffc);
      p->nSuppVars = iVar3;
      for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
        p->Copy[lVar11] = local_1260[lVar11];
      }
      iVar4 = Sfm_LibFindDelayMatches(p->pLib,*pTruth,*pSupp_00,iVar3,vGates,vFans);
      iVar15 = 0;
      if (iVar4 < 1) {
        iVar4 = iVar15;
      }
      i = 1;
      while (bVar16 = iVar4 != 0, iVar4 = iVar4 + -1, bVar16) {
        aVar9 = Abc_Clock();
        pGate = (Mio_Gate_t *)Vec_PtrEntry(vGates,i + -1);
        pGate_00 = (Mio_Gate_t *)Vec_PtrEntry(vGates,i);
        dVar18 = Mio_GateReadArea(pGate);
        if (pGate_00 == (Mio_Gate_t *)0x0) {
          dVar19 = 0.0;
        }
        else {
          dVar19 = Mio_GateReadArea(pGate_00);
        }
        iVar14 = (int)((float)(dVar18 + dVar19) * 1000.0);
        pFans1 = (char *)Vec_PtrEntry(vFans,i + -1);
        pFans2 = (char *)Vec_PtrEntry(vFans,i);
        vFanins.nCap = iVar3;
        vFanins.nSize = iVar3;
        vFanins.pArray = *pSupp_00;
        if (p->pMit == (Sfm_Mit_t *)0x0) {
          iVar7 = Sfm_TimEvalRemapping(p->pTim,&vFanins,p_00,pGate,pFans1,pGate_00,pFans2);
          iVar6 = p->pPars->DelAreaRatio;
          if (((iVar6 == 0) || (iVar14 - iVar5 == 0 || iVar14 < iVar5)) ||
             (iVar6 <= iVar7 / (iVar14 - iVar5))) {
            iVar6 = iVar15;
            if (iVar7 < local_12a8) goto LAB_0044ac48;
            goto LAB_0044ac89;
          }
        }
        else {
          iVar6 = Sfm_MitEvalRemapping
                            (p->pMit,&p->vGateMffc,pObj,&vFanins,p_00,pGate,pFans1,pGate_00,pFans2);
          iVar7 = p->pPars->DelAreaRatio;
          if (((iVar7 == 0) || (iVar14 - iVar5 == 0 || iVar14 < iVar5)) ||
             (iVar7 <= iVar6 / (iVar14 - iVar5))) {
            iVar7 = local_12a8;
            if (iVar15 < iVar6) {
LAB_0044ac48:
              local_12a8 = iVar7;
              iVar15 = iVar6;
              local_1280 = pGate;
              local_1268 = pFans2;
              local_1278 = pGate_00;
              local_1270 = pFans1;
              local_12a4 = (uint)uVar12;
            }
LAB_0044ac89:
            aVar10 = Abc_Clock();
            p->timeEval = p->timeEval + (aVar10 - aVar9);
          }
        }
        i = i + 2;
      }
    }
    iVar3 = iVar8 + 1;
    uVar12 = uVar12 + 1;
    local_1260 = local_1260 + 4;
  } while( true );
}

Assistant:

int Sfm_DecPeformDec3( Sfm_Dec_t * p, Abc_Obj_t * pObj )
{
    word uTruth[SFM_DEC_MAX][SFM_WORD_MAX], Masks[2][SFM_SIM_WORDS];
    int pSupp[SFM_DEC_MAX][2*SFM_SUPP_MAX];
    int nSupp[SFM_DEC_MAX], pAssump[SFM_WIN_MAX];
    int fVeryVerbose = p->pPars->fPrintDecs || p->pPars->fVeryVerbose;
    int nDecs = Abc_MaxInt(p->pPars->nDecMax, 1);
    int i, k, DelayOrig = 0, DelayMin, GainMax, AreaMffc, nMatches, iBest = -1, RetValue, Prev = 0; 
    Mio_Gate_t * pGate1Best = NULL, * pGate2Best = NULL; 
    char * pFans1Best = NULL, * pFans2Best = NULL;
    assert( p->pPars->fArea == 0 );
    p->DelayMin = 0;
    //Sfm_DecPrint( p, NULL );
    if ( fVeryVerbose )
        printf( "\nNode %4d : MFFC %2d\n", p->iTarget, p->nMffc );
    // set limit on search for decompositions in delay-model
    assert( p->pPars->nDecMax <= SFM_DEC_MAX );
    Sfm_ObjSetupSimInfo( pObj );
    Vec_IntClear( &p->vObjDec );
    for ( i = 0; i < nDecs; i++ )
    {
        GainMax = 0;
        DelayMin = DelayOrig = Sfm_ManReadObjDelay( p, Abc_ObjId(pObj) );
        // reduce the variable array
        if ( Vec_IntSize(&p->vObjDec) > Prev )
            Vec_IntShrink( &p->vObjDec, Prev );
        Prev = Vec_IntSize(&p->vObjDec) + 1;
        // perform decomposition 
        Abc_TtMask( Masks[0], SFM_SIM_WORDS, p->nPats[0] );
        Abc_TtMask( Masks[1], SFM_SIM_WORDS, p->nPats[1] );        
        nSupp[i] = Sfm_DecPeformDec_rec( p, uTruth[i], pSupp[i], pAssump, 0, Masks, 1, 0 );
        if ( nSupp[i] == -2 )
        {
            if ( fVeryVerbose )
                printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n", i, p->nPats[0], p->nPats[1] );
            continue;
        }
        if ( fVeryVerbose )
            printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  Supp = %d  ", i, p->nPats[0], p->nPats[1], nSupp[i] );
        if ( fVeryVerbose )
            Dau_DsdPrintFromTruth( uTruth[i], nSupp[i] );
        if ( p->pTim && nSupp[i] == 1 && uTruth[i][0] == ABC_CONST(0x5555555555555555) && DelayMin <= p->DelayInv + Sfm_ManReadObjDelay(p, Vec_IntEntry(&p->vObjMap, pSupp[i][0])) )
        {
            if ( fVeryVerbose )
                printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n", i, p->nPats[0], p->nPats[1] );
            continue;
        }
        if ( p->pMit && nSupp[i] == 1 && uTruth[i][0] == ABC_CONST(0x5555555555555555) )
        {
            if ( fVeryVerbose )
                printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n", i, p->nPats[0], p->nPats[1] );
            continue;
        }
        if ( nSupp[i] < 2 )
        {
            p->nSuppVars = nSupp[i];
            Abc_TtCopy( p->Copy, uTruth[i], SFM_WORD_MAX, 0 ); 
            RetValue = Sfm_LibImplementSimple( p->pLib, uTruth[i], pSupp[i], nSupp[i], &p->vObjGates, &p->vObjFanins );
            assert( nSupp[i] <= p->pPars->nVarMax );
            p->nLuckySizes[nSupp[i]]++;
            assert( RetValue <= 2 );
            p->nLuckyGates[RetValue]++;
            return RetValue;
        }

        // get MFFC
        Sfm_DecPrepareVec( &p->vObjMap, pSupp[i], nSupp[i], &p->vGateCut ); // returns cut in p->vGateCut
        AreaMffc = Sfm_DecMffcAreaReal(pObj, &p->vGateCut, &p->vGateMffc ); // returns MFFC in p->vGateMffc

        // try the delay
        p->nSuppVars = nSupp[i];
        Abc_TtCopy( p->Copy, uTruth[i], SFM_WORD_MAX, 0 ); 
        nMatches = Sfm_LibFindDelayMatches( p->pLib, uTruth[i], pSupp[i], nSupp[i], &p->vMatchGates, &p->vMatchFans );
        for ( k = 0; k < nMatches; k++ )
        {
            abctime clk = Abc_Clock();
            Mio_Gate_t * pGate1 = (Mio_Gate_t *)Vec_PtrEntry( &p->vMatchGates, 2*k+0 );
            Mio_Gate_t * pGate2 = (Mio_Gate_t *)Vec_PtrEntry( &p->vMatchGates, 2*k+1 );
            int AreaNew = Scl_Flt2Int( Mio_GateReadArea(pGate1) + (pGate2 ? Mio_GateReadArea(pGate2) : 0.0) );
            char * pFans1 = (char *)Vec_PtrEntry( &p->vMatchFans, 2*k+0 );
            char * pFans2 = (char *)Vec_PtrEntry( &p->vMatchFans, 2*k+1 );
            Vec_Int_t vFanins = { nSupp[i], nSupp[i], pSupp[i] };
            // skip identical gate
            //if ( pGate2 == NULL && pGate1 == (Mio_Gate_t *)pObj->pData )
            //    continue;
            if ( p->pMit )
            {
                int Gain = Sfm_MitEvalRemapping( p->pMit, &p->vGateMffc, pObj, &vFanins, &p->vObjMap, pGate1, pFans1, pGate2, pFans2 );
                if ( p->pPars->DelAreaRatio && AreaNew > AreaMffc && (Gain / (AreaNew - AreaMffc)) < p->pPars->DelAreaRatio )
                    continue;
                if ( GainMax < Gain )
                {
                    GainMax    = Gain;
                    pGate1Best = pGate1;
                    pGate2Best = pGate2;
                    pFans1Best = pFans1;
                    pFans2Best = pFans2;
                    iBest      = i;
                }
            }
            else
            {
                int Delay = Sfm_TimEvalRemapping( p->pTim, &vFanins, &p->vObjMap, pGate1, pFans1, pGate2, pFans2 );
                if ( p->pPars->DelAreaRatio && AreaNew > AreaMffc && (Delay / (AreaNew - AreaMffc)) < p->pPars->DelAreaRatio )
                    continue;
                if ( DelayMin > Delay )
                {
                    DelayMin   = Delay;
                    pGate1Best = pGate1;
                    pGate2Best = pGate2;
                    pFans1Best = pFans1;
                    pFans2Best = pFans2;
                    iBest      = i;
                }
            }
            p->timeEval += Abc_Clock() - clk;
        }
    }
//printf( "Gain max = %d.\n", GainMax );
    Sfm_ObjSetdownSimInfo( pObj );
    if ( iBest == -1 )
    {
        if ( fVeryVerbose )
            printf( "Best  : NO DEC.\n" );
        p->nNoDecs++;
        return -2;
    }
    if ( fVeryVerbose )
        printf( "Best %d: %d  ", iBest, nSupp[iBest] );
//    if ( fVeryVerbose )
//        Dau_DsdPrintFromTruth( uTruth[iBest], nSupp[iBest] );
    RetValue = Sfm_LibImplementGatesDelay( p->pLib, pSupp[iBest], pGate1Best, pGate2Best, pFans1Best, pFans2Best, &p->vObjGates, &p->vObjFanins );
    assert( nSupp[iBest] <= p->pPars->nVarMax );
    p->nLuckySizes[nSupp[iBest]]++;
    assert( RetValue <= 2 );
    p->nLuckyGates[RetValue]++;
    p->DelayMin = DelayMin;
    return 1;
}